

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O2

_Bool xdr_reply_encode(XDR *xdrs,rpc_msg *dmsg)

{
  reply_body *ip;
  anon_union_432_2_d8689e7e_for_ru *paVar1;
  xdr_discrim *pxVar2;
  reply_stat rVar3;
  uint uVar4;
  msg_type mVar5;
  accept_stat aVar6;
  xdr_op xVar7;
  xdrproc_t p_Var8;
  _Bool _Var9;
  uint *puVar10;
  ulong uVar11;
  undefined8 uVar12;
  xdrproc_t *pp_Var13;
  char *pcVar14;
  uint *__dest;
  
  ip = &(dmsg->ru).RM_rmb;
  rVar3 = (dmsg->ru).RM_rmb.rp_stat;
  uVar11 = (ulong)rVar3;
  if (rVar3 == MSG_DENIED) {
    puVar10 = (uint *)xdr_inline_encode(xdrs,0xc);
    uVar4 = dmsg->rm_xid;
    if (puVar10 != (uint *)0x0) {
      *puVar10 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      mVar5 = dmsg->rm_direction;
      puVar10[1] = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
      rVar3 = (dmsg->ru).RM_rmb.rp_stat;
      puVar10[2] = rVar3 >> 0x18 | (rVar3 & 0xff0000) >> 8 | (rVar3 & 0xff00) << 8 | rVar3 << 0x18;
LAB_0010fcc0:
      aVar6 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
      uVar11 = (ulong)aVar6;
      if (aVar6 == PROG_UNAVAIL) {
        if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_encode",0xee);
        }
        puVar10 = (uint *)xdr_inline_encode(xdrs,8);
        aVar6 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
        if (puVar10 != (uint *)0x0) {
          *puVar10 = aVar6 >> 0x18 | (aVar6 & 0xff0000) >> 8 | (aVar6 & 0xff00) << 8 | aVar6 << 0x18
          ;
          uVar4 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          puVar10[1] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18;
          return true;
        }
        _Var9 = xdr_putenum(xdrs,aVar6);
        if (_Var9) {
          _Var9 = xdr_putenum(xdrs,*(enum_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
          if (_Var9) {
            return true;
          }
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          uVar11 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          pcVar14 = "%s:%u ERROR rj_why %u";
          uVar12 = 0xfd;
        }
        else {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          uVar11 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
          pcVar14 = "%s:%u ERROR rj_stat %u";
          uVar12 = 0xf7;
        }
      }
      else if (aVar6 == SUCCESS) {
        if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_encode",0xd0);
        }
        puVar10 = (uint *)xdr_inline_encode(xdrs,0xc);
        aVar6 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
        if (puVar10 != (uint *)0x0) {
          *puVar10 = aVar6 >> 0x18 | (aVar6 & 0xff0000) >> 8 | (aVar6 & 0xff00) << 8 | aVar6 << 0x18
          ;
          uVar4 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
          puVar10[1] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18;
          uVar4 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
          puVar10[2] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18;
          return true;
        }
        _Var9 = xdr_putenum(xdrs,aVar6);
        if (_Var9) {
          _Var9 = xdr_putuint32(xdrs,*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
          if (_Var9) {
            _Var9 = xdr_putuint32(xdrs,*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
            if (_Var9) {
              return true;
            }
            if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
            pcVar14 = "%s:%u ERROR rj_vers.high %u";
            uVar12 = 0xe6;
          }
          else {
            if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)*(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
            pcVar14 = "%s:%u ERROR rj_vers.low %u";
            uVar12 = 0xe0;
          }
        }
        else {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          uVar11 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_stat;
          pcVar14 = "%s:%u ERROR rj_stat %u";
          uVar12 = 0xda;
        }
      }
      else {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar14 = "%s:%u ERROR rr->rj_stat (%u)";
        uVar12 = 0x105;
      }
      (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_reply_encode",uVar12,uVar11);
      return false;
    }
    _Var9 = xdr_putuint32(xdrs,uVar4);
    if (_Var9) {
      _Var9 = xdr_putenum(xdrs,dmsg->rm_direction);
      if (_Var9) {
        _Var9 = xdr_putenum(xdrs,ip->rp_stat);
        if (_Var9) goto LAB_0010fcc0;
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar11 = (ulong)ip->rp_stat;
        pcVar14 = "%s:%u ERROR rp_stat %u";
        uVar12 = 199;
      }
      else {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar11 = (ulong)dmsg->rm_direction;
        pcVar14 = "%s:%u ERROR rm_direction %u";
        uVar12 = 0xc1;
      }
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar11 = (ulong)dmsg->rm_xid;
      pcVar14 = "%s:%u ERROR rm_xid %u";
      uVar12 = 0xbb;
    }
LAB_0010fe4b:
    (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_reply_encode",uVar12,uVar11);
    return false;
  }
  if (rVar3 != MSG_ACCEPTED) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    pcVar14 = "%s:%u ERROR dmsg->rm_reply.rp_stat (%u)";
    uVar12 = 0x10e;
    goto LAB_0010fe4b;
  }
  uVar4 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
  if (400 < (ulong)uVar4) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR ar_verf.oa_length (%u) > %u","xdr_reply_encode",0x52,(ulong)uVar4,400);
    return false;
  }
  paVar1 = &(dmsg->ru).RM_rmb.ru;
  puVar10 = (uint *)xdr_inline_encode(xdrs,(ulong)(uVar4 + 3 & 0x3fc) + 0x18);
  if (puVar10 != (uint *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED INLINE","xdr_reply_encode",0x5d);
    }
    uVar4 = dmsg->rm_xid;
    *puVar10 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    mVar5 = dmsg->rm_direction;
    puVar10[1] = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
    rVar3 = (dmsg->ru).RM_rmb.rp_stat;
    puVar10[2] = rVar3 >> 0x18 | (rVar3 & 0xff0000) >> 8 | (rVar3 & 0xff00) << 8 | rVar3 << 0x18;
    uVar4 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_flavor;
    puVar10[3] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar4 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
    __dest = puVar10 + 5;
    puVar10[4] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar11 = (ulong)(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
    if (uVar11 != 0) {
      memcpy(__dest,(void *)((long)&(dmsg->ru).RM_rmb.ru + 0x20),uVar11);
      __dest = (uint *)((long)__dest +
                       (ulong)((dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length + 3 & 0xfffffffc));
    }
    aVar6 = (paVar1->RP_ar).ar_stat;
    *__dest = aVar6 >> 0x18 | (aVar6 & 0xff0000) >> 8 | (aVar6 & 0xff00) << 8 | aVar6 << 0x18;
    if ((paVar1->RP_ar).ar_stat != PROG_MISMATCH) {
      if ((paVar1->RP_ar).ar_stat != SUCCESS) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u SUCCESS","xdr_reply_encode",0x6d);
        return true;
      }
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_encode",0x73);
    }
    puVar10 = (uint *)xdr_inline_encode(xdrs,8);
    uVar4 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
    if (puVar10 != (uint *)0x0) {
      *puVar10 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      uVar4 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
      puVar10[1] = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      return true;
    }
    _Var9 = xdr_putuint32(xdrs,uVar4);
    if (_Var9) {
      _Var9 = xdr_putuint32(xdrs,*(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 0xc));
      if (_Var9) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar4 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
      pcVar14 = "%s:%u ERROR ar_vers.high %u";
      uVar12 = 0x84;
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar4 = *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
      pcVar14 = "%s:%u ERROR ar_vers.low %u";
      uVar12 = 0x7d;
    }
    (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_reply_encode",uVar12,(ulong)uVar4);
    return false;
  }
  if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)("%s:%u ACCEPTED non-INLINE","xdr_reply_encode",0x94);
  }
  _Var9 = xdr_putuint32(xdrs,dmsg->rm_xid);
  if (!_Var9) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    uVar11 = (ulong)dmsg->rm_xid;
    pcVar14 = "%s:%u ERROR rm_xid %u";
    uVar12 = 0x98;
    goto LAB_0010fe4b;
  }
  _Var9 = xdr_putenum(xdrs,dmsg->rm_direction);
  if (!_Var9) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    uVar11 = (ulong)dmsg->rm_direction;
    pcVar14 = "%s:%u ERROR rm_direction %u";
    uVar12 = 0x9f;
    goto LAB_0010fe4b;
  }
  xVar7 = xdrs->x_op;
  if (xVar7 == XDR_ENCODE) {
    _Var9 = xdr_putenum(xdrs,ip->rp_stat);
LAB_00110231:
    if (_Var9 == false) goto LAB_00110265;
  }
  else if (xVar7 != XDR_FREE) {
    if (xVar7 != XDR_DECODE) goto LAB_00110265;
    _Var9 = xdr_getuint32(xdrs,&ip->rp_stat);
    goto LAB_00110231;
  }
  pp_Var13 = &reply_dscrm[0].proc;
  do {
    p_Var8 = *pp_Var13;
    if (p_Var8 == (xdrproc_t)0x0) goto LAB_00110265;
    pxVar2 = (xdr_discrim *)(pp_Var13 + -1);
    pp_Var13 = pp_Var13 + 2;
  } while (pxVar2->value != ip->rp_stat);
  _Var9 = (*p_Var8)(xdrs,paVar1);
  if (_Var9) {
    return true;
  }
LAB_00110265:
  if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
    return false;
  }
  (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR inline_xdr_union","xdr_reply_encode",0xa9);
  return false;
}

Assistant:

bool
xdr_reply_encode(XDR *xdrs, struct rpc_msg *dmsg)
{
	struct opaque_auth *oa;
	int32_t *buf;

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		oa = &ar->ar_verf;
		if (oa->oa_length > MAX_AUTH_BYTES) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_verf.oa_length (%u) > %u",
				__func__, __LINE__,
				oa->oa_length,
				MAX_AUTH_BYTES);
			return (false);
		}
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT
						+ RNDUP(oa->oa_length));

		if (buf != NULL) {
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u ACCEPTED INLINE",
				__func__, __LINE__);
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
			IXDR_PUT_ENUM(buf, oa->oa_flavor);
			IXDR_PUT_INT32(buf, oa->oa_length);
			if (oa->oa_length) {
				memcpy(buf, oa->oa_body, oa->oa_length);
				buf += RNDUP(oa->oa_length) / sizeof(int32_t);
			}

			IXDR_PUT_ENUM(buf, ar->ar_stat);
			switch (ar->ar_stat) {
			case SUCCESS:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u SUCCESS",
					__func__, __LINE__);
				return (true);

			case PROG_MISMATCH:
				__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
					"%s:%u MISMATCH",
					__func__, __LINE__);
				buf = xdr_inline_encode(xdrs,
							2 * BYTES_PER_XDR_UNIT);
				if (buf != NULL) {
					IXDR_PUT_ENUM(buf, ar->ar_vers.low);
					IXDR_PUT_ENUM(buf, ar->ar_vers.high);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.low)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.low %u",
						__func__, __LINE__,
						ar->ar_vers.low);
					return (false);
				} else if (!xdr_putuint32(xdrs,
							  ar->ar_vers.high)) {
					__warnx(TIRPC_DEBUG_FLAG_ERROR,
						"%s:%u ERROR ar_vers.high %u",
						__func__, __LINE__,
						ar->ar_vers.high);
					return (false);
				}
				/* fallthru */
			case GARBAGE_ARGS:
			case SYSTEM_ERR:
			case PROC_UNAVAIL:
			case PROG_UNAVAIL:
				break;
			};
			return (true);
		}

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u ACCEPTED non-INLINE",
			__func__, __LINE__);
		if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		}
		if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		}
		if (!inline_xdr_union(xdrs,
				      (enum_t *) &(dmsg->rm_reply.rp_stat),
				      (void *)&(dmsg->rm_reply.ru),
				      reply_dscrm, NULL_xdrproc_t)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR inline_xdr_union",
				__func__, __LINE__);
			return (false);
		}
		return (true);
	}
	case MSG_DENIED:
	{
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			IXDR_PUT_INT32(buf, dmsg->rm_xid);
			IXDR_PUT_ENUM(buf, dmsg->rm_direction);
			IXDR_PUT_ENUM(buf, dmsg->rm_reply.rp_stat);
		} else if (!xdr_putuint32(xdrs, dmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				dmsg->rm_xid);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				dmsg->rm_direction);
			return (false);
		} else if (!xdr_putenum(xdrs, dmsg->rm_reply.rp_stat)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rp_stat %u",
				__func__, __LINE__,
				dmsg->rm_reply.rp_stat);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 3 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.low);
				IXDR_PUT_U_INT32(buf, rr->rj_vers.high);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.low)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low %u",
					__func__, __LINE__,
					rr->rj_vers.low);
				return (false);
			} else if (!xdr_putuint32(xdrs, rr->rj_vers.high)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high %u",
					__func__, __LINE__,
					rr->rj_vers.high);
				return (false);
			}
			return (true); /* bugfix */
		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			buf = xdr_inline_encode(xdrs, 2 * BYTES_PER_XDR_UNIT);

			if (buf != NULL) {
				IXDR_PUT_ENUM(buf, rr->rj_stat);
				IXDR_PUT_ENUM(buf, rr->rj_why);
			} else if (!xdr_putenum(xdrs, rr->rj_stat)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_stat %u",
					__func__, __LINE__,
					rr->rj_stat);
				return (false);
			} else if (!xdr_putenum(xdrs, rr->rj_why)) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why %u",
					__func__, __LINE__,
					rr->rj_why);
				return (false);
			}
			return (true); /* bugfix */
		default:
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rr->rj_stat (%u)",
				__func__, __LINE__,
				rr->rj_stat);
			break;
		};
		break;
	}
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat (%u)",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};

	return (false);
}